

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

void __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::~BucketAccum1Type(BucketAccum1Type<mp::QuadTerms> *this)

{
  long lVar1;
  
  lVar1 = 0x4ec0;
  do {
    QuadTerms::~QuadTerms
              ((QuadTerms *)
               ((long)(this->buckets_)._M_elems[0].folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.m_storage.m_data + lVar1 + -0x18));
    lVar1 = lVar1 + -0x140;
  } while (lVar1 != -0x140);
  return;
}

Assistant:

BucketAccum1Type<Body>::~BucketAccum1Type() {
#ifndef NDEBUG
  for (const auto& b: buckets_)
    assert(b.empty());
#endif
}